

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

char * httplib::status_message(int status)

{
  int status_local;
  char *local_8;
  
  switch(status) {
  case 100:
    local_8 = "Continue";
    break;
  case 0x65:
    local_8 = "Switching Protocol";
    break;
  case 0x66:
    local_8 = "Processing";
    break;
  case 0x67:
    local_8 = "Early Hints";
    break;
  default:
  case 500:
    local_8 = "Internal Server Error";
    break;
  case 200:
    local_8 = "OK";
    break;
  case 0xc9:
    local_8 = "Created";
    break;
  case 0xca:
    local_8 = "Accepted";
    break;
  case 0xcb:
    local_8 = "Non-Authoritative Information";
    break;
  case 0xcc:
    local_8 = "No Content";
    break;
  case 0xcd:
    local_8 = "Reset Content";
    break;
  case 0xce:
    local_8 = "Partial Content";
    break;
  case 0xcf:
    local_8 = "Multi-Status";
    break;
  case 0xd0:
    local_8 = "Already Reported";
    break;
  case 0xe2:
    local_8 = "IM Used";
    break;
  case 300:
    local_8 = "Multiple Choice";
    break;
  case 0x12d:
    local_8 = "Moved Permanently";
    break;
  case 0x12e:
    local_8 = "Found";
    break;
  case 0x12f:
    local_8 = "See Other";
    break;
  case 0x130:
    local_8 = "Not Modified";
    break;
  case 0x131:
    local_8 = "Use Proxy";
    break;
  case 0x132:
    local_8 = "unused";
    break;
  case 0x133:
    local_8 = "Temporary Redirect";
    break;
  case 0x134:
    local_8 = "Permanent Redirect";
    break;
  case 400:
    local_8 = "Bad Request";
    break;
  case 0x191:
    local_8 = "Unauthorized";
    break;
  case 0x192:
    local_8 = "Payment Required";
    break;
  case 0x193:
    local_8 = "Forbidden";
    break;
  case 0x194:
    local_8 = "Not Found";
    break;
  case 0x195:
    local_8 = "Method Not Allowed";
    break;
  case 0x196:
    local_8 = "Not Acceptable";
    break;
  case 0x197:
    local_8 = "Proxy Authentication Required";
    break;
  case 0x198:
    local_8 = "Request Timeout";
    break;
  case 0x199:
    local_8 = "Conflict";
    break;
  case 0x19a:
    local_8 = "Gone";
    break;
  case 0x19b:
    local_8 = "Length Required";
    break;
  case 0x19c:
    local_8 = "Precondition Failed";
    break;
  case 0x19d:
    local_8 = "Payload Too Large";
    break;
  case 0x19e:
    local_8 = "URI Too Long";
    break;
  case 0x19f:
    local_8 = "Unsupported Media Type";
    break;
  case 0x1a0:
    local_8 = "Range Not Satisfiable";
    break;
  case 0x1a1:
    local_8 = "Expectation Failed";
    break;
  case 0x1a2:
    local_8 = "I\'m a teapot";
    break;
  case 0x1a5:
    local_8 = "Misdirected Request";
    break;
  case 0x1a6:
    local_8 = "Unprocessable Entity";
    break;
  case 0x1a7:
    local_8 = "Locked";
    break;
  case 0x1a8:
    local_8 = "Failed Dependency";
    break;
  case 0x1a9:
    local_8 = "Too Early";
    break;
  case 0x1aa:
    local_8 = "Upgrade Required";
    break;
  case 0x1ac:
    local_8 = "Precondition Required";
    break;
  case 0x1ad:
    local_8 = "Too Many Requests";
    break;
  case 0x1af:
    local_8 = "Request Header Fields Too Large";
    break;
  case 0x1c3:
    local_8 = "Unavailable For Legal Reasons";
    break;
  case 0x1f5:
    local_8 = "Not Implemented";
    break;
  case 0x1f6:
    local_8 = "Bad Gateway";
    break;
  case 0x1f7:
    local_8 = "Service Unavailable";
    break;
  case 0x1f8:
    local_8 = "Gateway Timeout";
    break;
  case 0x1f9:
    local_8 = "HTTP Version Not Supported";
    break;
  case 0x1fa:
    local_8 = "Variant Also Negotiates";
    break;
  case 0x1fb:
    local_8 = "Insufficient Storage";
    break;
  case 0x1fc:
    local_8 = "Loop Detected";
    break;
  case 0x1fe:
    local_8 = "Not Extended";
    break;
  case 0x1ff:
    local_8 = "Network Authentication Required";
  }
  return local_8;
}

Assistant:

inline const char *status_message(int status) {
  switch (status) {
  case 100: return "Continue";
  case 101: return "Switching Protocol";
  case 102: return "Processing";
  case 103: return "Early Hints";
  case 200: return "OK";
  case 201: return "Created";
  case 202: return "Accepted";
  case 203: return "Non-Authoritative Information";
  case 204: return "No Content";
  case 205: return "Reset Content";
  case 206: return "Partial Content";
  case 207: return "Multi-Status";
  case 208: return "Already Reported";
  case 226: return "IM Used";
  case 300: return "Multiple Choice";
  case 301: return "Moved Permanently";
  case 302: return "Found";
  case 303: return "See Other";
  case 304: return "Not Modified";
  case 305: return "Use Proxy";
  case 306: return "unused";
  case 307: return "Temporary Redirect";
  case 308: return "Permanent Redirect";
  case 400: return "Bad Request";
  case 401: return "Unauthorized";
  case 402: return "Payment Required";
  case 403: return "Forbidden";
  case 404: return "Not Found";
  case 405: return "Method Not Allowed";
  case 406: return "Not Acceptable";
  case 407: return "Proxy Authentication Required";
  case 408: return "Request Timeout";
  case 409: return "Conflict";
  case 410: return "Gone";
  case 411: return "Length Required";
  case 412: return "Precondition Failed";
  case 413: return "Payload Too Large";
  case 414: return "URI Too Long";
  case 415: return "Unsupported Media Type";
  case 416: return "Range Not Satisfiable";
  case 417: return "Expectation Failed";
  case 418: return "I'm a teapot";
  case 421: return "Misdirected Request";
  case 422: return "Unprocessable Entity";
  case 423: return "Locked";
  case 424: return "Failed Dependency";
  case 425: return "Too Early";
  case 426: return "Upgrade Required";
  case 428: return "Precondition Required";
  case 429: return "Too Many Requests";
  case 431: return "Request Header Fields Too Large";
  case 451: return "Unavailable For Legal Reasons";
  case 501: return "Not Implemented";
  case 502: return "Bad Gateway";
  case 503: return "Service Unavailable";
  case 504: return "Gateway Timeout";
  case 505: return "HTTP Version Not Supported";
  case 506: return "Variant Also Negotiates";
  case 507: return "Insufficient Storage";
  case 508: return "Loop Detected";
  case 510: return "Not Extended";
  case 511: return "Network Authentication Required";

  default:
  case 500: return "Internal Server Error";
  }
}